

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void convolve_maxpool_padding_replicate
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int cstep,
               int filter_width_half,int filter_height_half)

{
  float local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_6c;
  float a;
  int jj;
  int m;
  int ii;
  int l;
  int off;
  int k;
  float sum;
  int ww;
  int hh;
  int v;
  int w;
  int u;
  int h;
  int i;
  float **output_local;
  CNN_LAYER_CONFIG *layer_config_local;
  int in_stride_local;
  int in_height_local;
  int in_width_local;
  
  for (u = 0; u < layer_config->out_channels; u = u + 1) {
    v = 0;
    for (w = 0; w < in_height; w = layer_config->skip_height + w) {
      ww = 0;
      for (hh = 0; hh < in_width; hh = layer_config->skip_width + hh) {
        sum = (float)w;
        while( true ) {
          local_6c = in_height;
          if (w + layer_config->skip_height <= in_height) {
            local_6c = w + layer_config->skip_height;
          }
          if (local_6c <= (int)sum) break;
          k = hh;
          while( true ) {
            local_74 = in_width;
            if (hh + layer_config->skip_width <= in_width) {
              local_74 = hh + layer_config->skip_width;
            }
            if (local_74 <= k) break;
            off = (int)layer_config->bias[u];
            for (l = 0; l < layer_config->in_channels; l = l + 1) {
              ii = l * layer_config->out_channels + u;
              for (m = 0; m < layer_config->filter_height; m = m + 1) {
                if (((int)sum + m) - filter_height_half < 0) {
                  local_78 = 0;
                }
                else {
                  if (((int)sum + m) - filter_height_half < in_height) {
                    local_7c = ((int)sum + m) - filter_height_half;
                  }
                  else {
                    local_7c = in_height + -1;
                  }
                  local_78 = local_7c;
                }
                for (a = 0.0; (int)a < layer_config->filter_width; a = (float)((int)a + 1)) {
                  if ((k + (int)a) - filter_width_half < 0) {
                    local_80 = 0;
                  }
                  else {
                    if ((k + (int)a) - filter_width_half < in_width) {
                      local_84 = (k + (int)a) - filter_width_half;
                    }
                    else {
                      local_84 = in_width + -1;
                    }
                    local_80 = local_84;
                  }
                  off = (int)(layer_config->weights[ii] * input[l][local_78 * in_stride + local_80]
                             + (float)off);
                  ii = cstep + ii;
                }
              }
            }
            if (((float)w == sum) && (hh == k)) {
              output[u][v * out_stride + ww] = (float)off;
            }
            else {
              if (output[u][v * out_stride + ww] <= (float)off) {
                local_88 = (float)off;
              }
              else {
                local_88 = output[u][v * out_stride + ww];
              }
              output[u][v * out_stride + ww] = local_88;
            }
            k = k + 1;
          }
          sum = (float)((int)sum + 1);
        }
        ww = ww + 1;
      }
      v = v + 1;
    }
  }
  return;
}

Assistant:

static void convolve_maxpool_padding_replicate(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    const int cstep, const int filter_width_half,
    const int filter_height_half) {
  for (int i = 0; i < layer_config->out_channels; ++i) {
    for (int h = 0, u = 0; h < in_height; h += layer_config->skip_height, ++u) {
      for (int w = 0, v = 0; w < in_width; w += layer_config->skip_width, ++v) {
        for (int hh = h; hh < AOMMIN(in_height, h + layer_config->skip_height);
             ++hh) {
          for (int ww = w; ww < AOMMIN(in_width, w + layer_config->skip_width);
               ++ww) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int ii =
                    CLAMPINDEX(hh + l - filter_height_half, in_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int jj =
                      CLAMPINDEX(ww + m - filter_width_half, in_width);
                  assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            const float a = sum;
            if (h == hh && w == ww)
              output[i][u * out_stride + v] = a;
            else
              output[i][u * out_stride + v] =
                  AOMMAX(output[i][u * out_stride + v], a);
          }
        }
      }
    }
  }
}